

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O3

void InitBotStuff(void)

{
  byte *pbVar1;
  BYTE *pBVar2;
  int iVar3;
  undefined8 in_RAX;
  PClass *pPVar4;
  PClassActor *pPVar5;
  PClass *pPVar6;
  uint i;
  long lVar7;
  undefined8 local_38;
  
  lVar7 = 0;
  local_38 = in_RAX;
  do {
    iVar3 = FName::NameManager::FindName(&FName::NameData,InitBotStuff::botinits[lVar7].type,true);
    local_38 = CONCAT44(local_38._4_4_,iVar3);
    pPVar4 = PClass::FindClass((FName *)&local_38);
    if (pPVar4 != (PClass *)0x0) {
      pPVar6 = pPVar4;
      if (pPVar4 != AWeapon::RegistrationInfo.MyClass) {
        do {
          pPVar6 = pPVar6->ParentClass;
          if (pPVar6 == AWeapon::RegistrationInfo.MyClass) break;
        } while (pPVar6 != (PClass *)0x0);
        if (pPVar6 == (PClass *)0x0) goto LAB_0034b855;
      }
      pBVar2 = pPVar4->Defaults;
      if (pBVar2 != (BYTE *)0x0) {
        *(double *)(pBVar2 + 0x560) =
             (double)InitBotStuff::botinits[lVar7].movecombatdist * 1.52587890625e-05;
        *(uint *)(pBVar2 + 0x4fc) =
             *(uint *)(pBVar2 + 0x4fc) | InitBotStuff::botinits[lVar7].weaponflags;
        pPVar5 = PClass::FindActor(InitBotStuff::botinits[lVar7].projectile);
        *(PClassActor **)(pBVar2 + 0x540) = pPVar5;
      }
    }
LAB_0034b855:
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x24) {
      lVar7 = 0;
      do {
        iVar3 = FName::NameManager::FindName
                          (&FName::NameData,
                           (char *)((long)&_ZZ12InitBotStuffvE15warnbotmissiles_rel +
                                   (long)*(int *)((long)&_ZZ12InitBotStuffvE15warnbotmissiles_rel +
                                                 lVar7)),true);
        local_38 = CONCAT44(iVar3,local_38._0_4_);
        pPVar4 = PClass::FindClass((FName *)((long)&local_38 + 4));
        if (pPVar4->Defaults != (BYTE *)0x0) {
          pbVar1 = pPVar4->Defaults + 0x1c7;
          *pbVar1 = *pbVar1 | 0x20;
        }
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0xc);
      return;
    }
  } while( true );
}

Assistant:

void InitBotStuff()
{
	static struct BotInit
	{
		const char *type;
		int movecombatdist;
		int weaponflags;
		const char *projectile;
	} botinits[] = {

		{ "Pistol", 25000000, 0, NULL },
		{ "Shotgun", 24000000, 0, NULL },
		{ "SuperShotgun", 15000000, 0, NULL },
		{ "Chaingun", 27000000, 0, NULL },
		{ "RocketLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "Rocket" },
		{ "PlasmaRifle",  27000000, 0, "PlasmaBall" },
		{ "BFG9000", 10000000, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_BFG, "BFGBall" },
		{ "GoldWand", 25000000, 0, NULL },
		{ "GoldWandPowered", 25000000, 0, NULL },
		{ "Crossbow", 24000000, 0, "CrossbowFX1" },
		{ "CrossbowPowered", 24000000, 0, "CrossbowFX2" },
		{ "Blaster", 27000000, 0, NULL },
		{ "BlasterPowered", 27000000, 0, "BlasterFX1" },
		{ "SkullRod", 27000000, 0, "HornRodFX1" },
		{ "SkullRodPowered", 27000000, 0, "HornRodFX2" },
		{ "PhoenixRod", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "PhoenixFX1" },
		{ "Mace", 27000000, WIF_BOT_REACTION_SKILL_THING, "MaceFX2" },
		{ "MacePowered", 27000000, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "MaceFX4" },
		{ "FWeapHammer", 22000000, 0, "HammerMissile" },
		{ "FWeapQuietus", 20000000, 0, "FSwordMissile" },
		{ "CWeapStaff", 25000000, 0, "CStaffMissile" },
		{ "CWeapFlane", 27000000, 0, "CFlameMissile" },
		{ "MWeapWand", 25000000, 0, "MageWandMissile" },
		{ "CWeapWraithverge", 22000000, 0, "HolyMissile" },
		{ "MWeapFrost", 19000000, 0, "FrostMissile" },
		{ "MWeapLightning", 23000000, 0, "LightningFloor" },
		{ "MWeapBloodscourge", 20000000, 0, "MageStaffFX2" },
		{ "StrifeCrossbow", 24000000, 0, "ElectricBolt" },
		{ "StrifeCrossbow2", 24000000, 0, "PoisonBolt" },
		{ "AssaultGun", 27000000, 0, NULL },
		{ "MiniMissileLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "MiniMissile" },
		{ "FlameThrower", 24000000, 0, "FlameMissile" },
		{ "Mauler", 15000000, 0, NULL },
		{ "Mauler2", 10000000, 0, "MaulerTorpedo" },
		{ "StrifeGrenadeLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "HEGrenade" },
		{ "StrifeGrenadeLauncher2", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "PhosphorousGrenade" },
	};

	for(unsigned i=0;i<sizeof(botinits)/sizeof(botinits[0]);i++)
	{
		const PClass *cls = PClass::FindClass(botinits[i].type);
		if (cls != NULL && cls->IsDescendantOf(RUNTIME_CLASS(AWeapon)))
		{
			AWeapon *w = (AWeapon*)GetDefaultByType(cls);
			if (w != NULL)
			{
				w->MoveCombatDist = botinits[i].movecombatdist/65536.;
				w->WeaponFlags |= botinits[i].weaponflags;
				w->ProjectileType = PClass::FindActor(botinits[i].projectile);
			}
		}
	}

	static const char *warnbotmissiles[] = { "PlasmaBall", "Ripper", "HornRodFX1" };
	for(unsigned i=0;i<countof(warnbotmissiles);i++)
	{
		AActor *a = GetDefaultByName (warnbotmissiles[i]);
		if (a != NULL)
		{
			a->flags3|=MF3_WARNBOT;
		}
	}
}